

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_map.hpp
# Opt level: O1

fixed_size_map_iterator<duckdb::list_entry_t,_true> * __thiscall
duckdb::fixed_size_map_iterator<duckdb::list_entry_t,_true>::operator++
          (fixed_size_map_iterator<duckdb::list_entry_t,_true> *this)

{
  uchar *puVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  
  iVar2 = this->idx_in_entry + 1;
  this->idx_in_entry = iVar2;
  if (iVar2 == 8) {
    this->entry_idx = this->entry_idx + 1;
    this->idx_in_entry = 0;
  }
  uVar3 = this->entry_idx;
  uVar4 = this->map->capacity;
  uVar5 = uVar4 >> 3;
  uVar4 = (ulong)((uint)uVar4 & 7);
  iVar2 = this->idx_in_entry;
  do {
    if (uVar5 <= uVar3) {
      if (uVar3 != uVar5) {
        return this;
      }
      if (uVar4 <= iVar2) {
        return this;
      }
    }
    puVar1 = (this->map->occupied).validity_mask;
    if (puVar1[uVar3] == '\0') {
      if (uVar3 == uVar5) {
        this->idx_in_entry = uVar4;
        cVar7 = '\x03';
        iVar2 = uVar4;
      }
      else {
        uVar3 = uVar3 + 1;
        this->entry_idx = uVar3;
        this->idx_in_entry = 0;
        iVar2 = 0;
        cVar7 = '\0';
      }
    }
    else {
      uVar6 = 8;
      if (uVar3 == uVar5) {
        uVar6 = uVar4;
      }
      cVar7 = iVar2 < uVar6;
      if ((bool)cVar7) {
        if ((puVar1[uVar3] >> ((uint)iVar2 & 0x1f) & 1) == 0) {
          do {
            iVar2 = iVar2 + 1;
            this->idx_in_entry = iVar2;
            if (uVar6 == iVar2) {
              cVar7 = false;
              iVar2 = uVar6;
              goto LAB_00db5f11;
            }
          } while ((puVar1[uVar3] >> ((uint)iVar2 & 0x1f) & 1) == 0);
          cVar7 = iVar2 < uVar6;
        }
      }
      else {
LAB_00db5f11:
        if ((uVar3 != uVar5) || (iVar2 != uVar4)) {
          uVar3 = uVar3 + 1;
          this->entry_idx = uVar3;
          this->idx_in_entry = 0;
          iVar2 = 0;
        }
      }
    }
    if (cVar7 != '\0') {
      return this;
    }
  } while( true );
}

Assistant:

fixed_size_map_iterator &operator++() {
		// Prefix increment
		if (++idx_in_entry == occupied_mask::BITS_PER_VALUE) {
			NextEntry();
		}
		// Loop until we find an occupied index, or until the end
		auto end = map.end();
		while (*this < end) {
			const auto &entry = map.occupied.GetValidityEntryUnsafe(entry_idx);
			if (entry == static_cast<uint8_t>(~occupied_mask::ValidityBuffer::MAX_ENTRY)) {
				// Entire entry is unoccupied, skip
				if (entry_idx == end.entry_idx) {
					// This is the last entry
					idx_in_entry = end.idx_in_entry;
					break;
				}
				NextEntry();
			} else {
				// One or more occupied in entry, loop over it
				const auto idx_to = entry_idx == end.entry_idx ? end.idx_in_entry : occupied_mask::BITS_PER_VALUE;
				for (; idx_in_entry < idx_to; idx_in_entry++) {
					if (map.occupied.RowIsValid(entry, idx_in_entry)) {
						// We found an occupied index
						return *this;
					}
				}
				// We did not find an occupied index
				if (*this != end) {
					NextEntry();
				}
			}
		}
		return *this;
	}